

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::~IfcStructuralLinearAction
          (IfcStructuralLinearAction *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x8d2760;
  *(undefined8 *)&this->field_0x1a8 = 0x8d2878;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = 0x8d2788;
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8d27b0;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x8d27d8;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0x8d2800;
  *(undefined8 *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 =
       0x8d2828;
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x178 = 0x8d2850;
  puVar1 = *(undefined1 **)&(this->super_IfcStructuralAction).field_0x188;
  if (puVar1 != &this->field_0x198) {
    operator_delete(puVar1);
  }
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x8d2a28;
  *(undefined8 *)&this->field_0x1a8 = 0x8d2b18;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = 0x8d2a50;
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8d2a78;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x8d2aa0;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0x8d2ac8;
  *(undefined8 *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 =
       0x8d2af0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x148;
  if (puVar1 != &(this->super_IfcStructuralAction).field_0x158) {
    operator_delete(puVar1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this,&PTR_construction_vtable_24__008d2898);
  operator_delete(this);
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}